

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

int __thiscall CVmRun::xor_and_push(CVmRun *this,vm_val_t *val1,vm_val_t *val2)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  vm_val_t *in_RDX;
  CVmRun *in_RSI;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  CVmRun *in_stack_ffffffffffffffc0;
  
  iVar1 = vm_val_t::is_logical((vm_val_t *)in_RSI);
  if ((iVar1 == 0) || (iVar1 = vm_val_t::is_logical(in_RDX), iVar1 == 0)) {
    iVar1 = vm_val_t::is_logical((vm_val_t *)in_RSI);
    if ((iVar1 == 0) && (iVar1 = vm_val_t::is_logical(in_RDX), iVar1 == 0)) {
      if ((*(vm_datatype_t *)&(in_RSI->super_CVmStack).arr_ != VM_INT) || (in_RDX->typ != VM_INT)) {
        return 0;
      }
      ((anon_union_8_8_cb74652f_for_val *)&(in_RSI->super_CVmStack).max_depth_)->obj =
           ((anon_union_8_8_cb74652f_for_val *)&(in_RSI->super_CVmStack).max_depth_)->obj ^
           (in_RDX->val).obj;
    }
    else {
      iVar1 = vm_val_t::is_logical((vm_val_t *)in_RSI);
      if (iVar1 == 0) {
        vm_val_t::num_to_logical((vm_val_t *)in_stack_ffffffffffffffc0);
      }
      else {
        iVar1 = vm_val_t::is_logical(in_RDX);
        if (iVar1 == 0) {
          vm_val_t::num_to_logical((vm_val_t *)in_stack_ffffffffffffffc0);
        }
      }
      in_stack_ffffffffffffffbc = vm_val_t::get_logical((vm_val_t *)in_RSI);
      uVar2 = vm_val_t::get_logical(in_RDX);
      vm_val_t::set_logical((vm_val_t *)in_RSI,in_stack_ffffffffffffffbc ^ uVar2);
      in_stack_ffffffffffffffc0 = in_RSI;
    }
  }
  else {
    uVar2 = vm_val_t::get_logical((vm_val_t *)in_RSI);
    uVar3 = vm_val_t::get_logical(in_RDX);
    vm_val_t::set_logical((vm_val_t *)in_RSI,uVar2 ^ uVar3);
  }
  pushval(in_stack_ffffffffffffffc0,
          (vm_val_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  return 1;
}

Assistant:

int CVmRun::xor_and_push(VMG_ vm_val_t *val1, vm_val_t *val2)
{
    /* figure what to do based on the types */
    if (val1->is_logical() && val2->is_logical())
    {
        /* both values are logical - compute the logical XOR */
        val1->set_logical(val1->get_logical() ^ val2->get_logical());
    }
    else if (val1->is_logical() || val2->is_logical())
    {
        /* 
         *   one value is logical, but not both - convert the other value
         *   from a number to a logical and compute the result as a
         *   logical value 
         */
        if (!val1->is_logical())
            val1->num_to_logical();
        else if (!val2->is_logical())
            val2->num_to_logical();

        /* compute the logical xor */
        val1->set_logical(val1->get_logical() ^ val2->get_logical());
    }
    else if (val1->typ == VM_INT && val2->typ == VM_INT)
    {
        /* compute and store the bitwise XOR */
        val1->val.intval = val1->val.intval ^ val2->val.intval;
    }
    else
    {
        /* there's no logical conversion, so we can't compute it here */
        return FALSE;
    }

    /* push the result */
    pushval(vmg_ val1);

    /* handled */
    return TRUE;
}